

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

int deqp::gles3::Functional::numBitsLostInOp(float input,float output)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Float<unsigned_int,_8,_23,_127,_3U> local_10;
  Float<unsigned_int,_8,_23,_127,_3U> local_c;
  
  local_c.m_value = (StorageType)input;
  iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_c);
  local_10.m_value = (StorageType)output;
  iVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_10);
  iVar1 = 0;
  if (0 < iVar2 - iVar3) {
    iVar1 = iVar2 - iVar3;
  }
  return iVar1;
}

Assistant:

inline int numBitsLostInOp (float input, float output)
{
	const int	inExp		= tcu::Float32(input).exponent();
	const int	outExp		= tcu::Float32(output).exponent();

	return de::max(0, inExp-outExp); // Lost due to mantissa shift.
}